

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampDepthCompareCase::init
          (TextureBorderClampDepthCompareCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  size_type sVar2;
  float fVar3;
  Vector<float,_4> local_398;
  Vector<float,_4> local_388;
  reference local_378;
  IterationConfig *iteration_5;
  int ndx;
  GenericVec4 local_358;
  Vector<float,_2> local_348;
  Vector<float,_2> local_340;
  undefined1 local_338 [8];
  IterationConfig iteration_4;
  GenericVec4 local_2b0;
  Vector<float,_2> local_2a0;
  Vector<float,_2> local_298;
  undefined1 local_290 [8];
  IterationConfig iteration_3;
  GenericVec4 local_208;
  Vector<float,_2> local_1f8;
  Vector<float,_2> local_1f0;
  undefined1 local_1e8 [8];
  IterationConfig iteration_2;
  GenericVec4 local_160;
  Vector<float,_2> local_150;
  Vector<float,_2> local_148;
  undefined1 local_140 [8];
  IterationConfig iteration_1;
  GenericVec4 local_b4;
  Vector<float,_2> local_a4 [2];
  Vector<float,_2> local_90;
  undefined1 local_88 [8];
  IterationConfig iteration;
  TextureBorderClampDepthCompareCase *this_local;
  
  iteration._112_8_ = this;
  TextureBorderClampTest::init(&this->super_TextureBorderClampTest,ctx);
  TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_88);
  tcu::Vector<float,_2>::Vector(&local_90,-0.15,-0.35);
  local_88._0_4_ = local_90.m_data[0];
  local_88._4_4_ = local_90.m_data[1];
  tcu::Vector<float,_2>::Vector(local_a4,1.25,1.1);
  iteration.p0.m_data[0] = local_a4[0].m_data[0];
  iteration.p0.m_data[1] = local_a4[0].m_data[1];
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&iteration_1.compareRef,0.7,0.0,0.0,0.0);
  rr::GenericVec4::GenericVec4<float>(&local_b4,(Vector<float,_4> *)&iteration_1.compareRef);
  rr::GenericVec4::operator=((GenericVec4 *)&iteration.p1,&local_b4);
  std::__cxx11::string::operator=((string *)&iteration.minFilter,"Border color in [0, 1] range");
  iteration.sWrapMode = 0x203;
  iteration.tWrapMode = 0x3f000000;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(&this->m_iterations,(value_type *)local_88);
  TextureBorderClampTest::IterationConfig::~IterationConfig((IterationConfig *)local_88);
  TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_140);
  tcu::Vector<float,_2>::Vector(&local_148,-0.15,-0.35);
  local_140._0_4_ = local_148.m_data[0];
  local_140._4_4_ = local_148.m_data[1];
  tcu::Vector<float,_2>::Vector(&local_150,1.25,1.1);
  iteration_1.p0.m_data[0] = local_150.m_data[0];
  iteration_1.p0.m_data[1] = local_150.m_data[1];
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&iteration_2.compareMode,1.5,0.0,0.0,0.0);
  rr::GenericVec4::GenericVec4<float>(&local_160,(Vector<float,_4> *)&iteration_2.compareMode);
  rr::GenericVec4::operator=((GenericVec4 *)&iteration_1.p1,&local_160);
  std::__cxx11::string::operator=
            ((string *)&iteration_1.minFilter,"Border color > 1, should be clamped");
  iteration_1.sWrapMode = 0x203;
  iteration_1.tWrapMode = 0x3f800000;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(&this->m_iterations,(value_type *)local_140);
  TextureBorderClampTest::IterationConfig::~IterationConfig((IterationConfig *)local_140);
  TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_1e8);
  tcu::Vector<float,_2>::Vector(&local_1f0,-0.15,-0.35);
  local_1e8._0_4_ = local_1f0.m_data[0];
  local_1e8._4_4_ = local_1f0.m_data[1];
  tcu::Vector<float,_2>::Vector(&local_1f8,1.25,1.1);
  iteration_2.p0.m_data[0] = local_1f8.m_data[0];
  iteration_2.p0.m_data[1] = local_1f8.m_data[1];
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&iteration_3.compareMode,-0.5,0.0,0.0,0.0);
  rr::GenericVec4::GenericVec4<float>(&local_208,(Vector<float,_4> *)&iteration_3.compareMode);
  rr::GenericVec4::operator=((GenericVec4 *)&iteration_2.p1,&local_208);
  std::__cxx11::string::operator=
            ((string *)&iteration_2.minFilter,"Border color < 0, should be clamped");
  iteration_2.sWrapMode = 0x206;
  iteration_2.tWrapMode = 0;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(&this->m_iterations,(value_type *)local_1e8);
  TextureBorderClampTest::IterationConfig::~IterationConfig((IterationConfig *)local_1e8);
  TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_290);
  tcu::Vector<float,_2>::Vector(&local_298,-0.15,-0.35);
  local_290._0_4_ = local_298.m_data[0];
  local_290._4_4_ = local_298.m_data[1];
  tcu::Vector<float,_2>::Vector(&local_2a0,1.25,1.1);
  iteration_3.p0.m_data[0] = local_2a0.m_data[0];
  iteration_3.p0.m_data[1] = local_2a0.m_data[1];
  fVar3 = std::numeric_limits<float>::infinity();
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&iteration_4.compareMode,fVar3,0.0,0.0,0.0);
  rr::GenericVec4::GenericVec4<float>(&local_2b0,(Vector<float,_4> *)&iteration_4.compareMode);
  rr::GenericVec4::operator=((GenericVec4 *)&iteration_3.p1,&local_2b0);
  std::__cxx11::string::operator=
            ((string *)&iteration_3.minFilter,"Border color == inf, should be clamped; ref > 1");
  iteration_3.sWrapMode = 0x201;
  iteration_3.tWrapMode = 0x3fa00000;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(&this->m_iterations,(value_type *)local_290);
  TextureBorderClampTest::IterationConfig::~IterationConfig((IterationConfig *)local_290);
  TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_338);
  tcu::Vector<float,_2>::Vector(&local_340,-0.15,-0.35);
  local_338._0_4_ = local_340.m_data[0];
  local_338._4_4_ = local_340.m_data[1];
  tcu::Vector<float,_2>::Vector(&local_348,1.25,1.1);
  iteration_4.p0.m_data[0] = local_348.m_data[0];
  iteration_4.p0.m_data[1] = local_348.m_data[1];
  fVar3 = std::numeric_limits<float>::infinity();
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffffc98,-fVar3,0.0,0.0,0.0);
  rr::GenericVec4::GenericVec4<float>(&local_358,(Vector<float,_4> *)&stack0xfffffffffffffc98);
  rr::GenericVec4::operator=((GenericVec4 *)&iteration_4.p1,&local_358);
  std::__cxx11::string::operator=
            ((string *)&iteration_4.minFilter,"Border color == inf, should be clamped; ref < 0");
  iteration_4.sWrapMode = 0x204;
  iteration_4.tWrapMode = 0xbf000000;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(&this->m_iterations,(value_type *)local_338);
  TextureBorderClampTest::IterationConfig::~IterationConfig((IterationConfig *)local_338);
  iteration_5._4_4_ = 0;
  while( true ) {
    iVar1 = iteration_5._4_4_;
    sVar2 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
            ::size(&this->m_iterations);
    if ((int)sVar2 <= iVar1) break;
    local_378 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
                ::operator[](&this->m_iterations,(long)iteration_5._4_4_);
    tcu::Vector<float,_4>::Vector(&local_388,1.0);
    *(undefined8 *)(local_378->lookupScale).m_data = local_388.m_data._0_8_;
    *(undefined8 *)((local_378->lookupScale).m_data + 2) = local_388.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_398,0.0);
    *(undefined8 *)(local_378->lookupBias).m_data = local_398.m_data._0_8_;
    *(undefined8 *)((local_378->lookupBias).m_data + 2) = local_398.m_data._8_8_;
    local_378->minFilter = this->m_filter;
    local_378->magFilter = this->m_filter;
    local_378->sWrapMode = 0x812d;
    local_378->tWrapMode = 0x812d;
    iteration_5._4_4_ = iteration_5._4_4_ + 1;
  }
  return iVar1;
}

Assistant:

void TextureBorderClampDepthCompareCase::init (void)
{
	TextureBorderClampTest::init();

	// 0.5 <= 0.7
	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-0.15f, -0.35f);
		iteration.p1			= tcu::Vec2( 1.25f,  1.1f);
		iteration.borderColor	= rr::GenericVec4(tcu::Vec4(0.7f, 0.0f, 0.0f, 0.0f));
		iteration.description	= "Border color in [0, 1] range";
		iteration.compareMode	= GL_LEQUAL;
		iteration.compareRef	= 0.5f;
		m_iterations.push_back(iteration);
	}

	// 1.5 <= 1.0
	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-0.15f, -0.35f);
		iteration.p1			= tcu::Vec2( 1.25f,  1.1f);
		iteration.borderColor	= rr::GenericVec4(tcu::Vec4(1.5f, 0.0f, 0.0f, 0.0f));
		iteration.description	= "Border color > 1, should be clamped";
		iteration.compareMode	= GL_LEQUAL;
		iteration.compareRef	= 1.0f;
		m_iterations.push_back(iteration);
	}

	// -0.5 >= 0.0
	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-0.15f, -0.35f);
		iteration.p1			= tcu::Vec2( 1.25f,  1.1f);
		iteration.borderColor	= rr::GenericVec4(tcu::Vec4(-0.5f, 0.0f, 0.0f, 0.0f));
		iteration.description	= "Border color < 0, should be clamped";
		iteration.compareMode	= GL_GEQUAL;
		iteration.compareRef	= 0.0f;
		m_iterations.push_back(iteration);
	}

	// inf < 1.25
	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-0.15f, -0.35f);
		iteration.p1			= tcu::Vec2( 1.25f,  1.1f);
		iteration.borderColor	= rr::GenericVec4(tcu::Vec4(std::numeric_limits<float>::infinity(), 0.0f, 0.0f, 0.0f));
		iteration.description	= "Border color == inf, should be clamped; ref > 1";
		iteration.compareMode	= GL_LESS;
		iteration.compareRef	= 1.25f;
		m_iterations.push_back(iteration);
	}

	// -inf > -0.5
	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-0.15f, -0.35f);
		iteration.p1			= tcu::Vec2( 1.25f,  1.1f);
		iteration.borderColor	= rr::GenericVec4(tcu::Vec4(-std::numeric_limits<float>::infinity(), 0.0f, 0.0f, 0.0f));
		iteration.description	= "Border color == inf, should be clamped; ref < 0";
		iteration.compareMode	= GL_GREATER;
		iteration.compareRef	= -0.5f;
		m_iterations.push_back(iteration);
	}

	// common parameters
	for (int ndx = 0; ndx < (int)m_iterations.size(); ++ndx)
	{
		IterationConfig& iteration = m_iterations[ndx];

		iteration.lookupScale	= tcu::Vec4(1.0);
		iteration.lookupBias	= tcu::Vec4(0.0);
		iteration.minFilter		= m_filter;
		iteration.magFilter		= m_filter;
		iteration.sWrapMode		= GL_CLAMP_TO_BORDER;
		iteration.tWrapMode		= GL_CLAMP_TO_BORDER;
	}
}